

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* pbrt::MatchingFilenames
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *filenameBase)

{
  int iVar1;
  DIR *__dirp;
  dirent *pdVar2;
  path local_118;
  pointer local_f0;
  path basePath;
  string dirStr;
  path local_a0;
  path local_78;
  string local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  filesystem::path::path(&basePath,filenameBase);
  filesystem::path::parent_path(&local_118,&basePath);
  filesystem::path::str_abi_cxx11_(&dirStr,&local_118,native_path);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_118.m_path);
  if (dirStr._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&dirStr);
  }
  __dirp = opendir(dirStr._M_dataplus._M_p);
  if (__dirp != (DIR *)0x0) {
    filesystem::path::filename_abi_cxx11_((string *)&local_118,&basePath);
    local_f0 = local_118.m_path.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::~string((string *)&local_118);
    while( true ) {
      pdVar2 = readdir(__dirp);
      if (pdVar2 == (dirent *)0x0) break;
      if (pdVar2->d_type == '\b') {
        filesystem::path::filename_abi_cxx11_((string *)&local_118,&basePath);
        iVar1 = strncmp((char *)local_118._0_8_,pdVar2->d_name,(size_t)local_f0);
        std::__cxx11::string::~string((string *)&local_118);
        if (iVar1 == 0) {
          filesystem::path::parent_path(&local_a0,&basePath);
          filesystem::path::path(&local_78,pdVar2->d_name);
          filesystem::path::operator/(&local_118,&local_a0,&local_78);
          filesystem::path::str_abi_cxx11_(&local_50,&local_118,native_path);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_118.m_path);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_78.m_path);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_a0.m_path);
        }
      }
    }
    closedir(__dirp);
    std::__cxx11::string::~string((string *)&dirStr);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&basePath.m_path);
    return __return_storage_ptr__;
  }
  filesystem::path::parent_path(&local_118,&basePath);
  filesystem::path::str_abi_cxx11_((string *)&local_a0,&local_118,native_path);
  local_78.m_type = local_a0.m_type;
  local_78._4_4_ = local_a0._4_4_;
  ErrorExit<char_const*>("%s: unable to open directory\n",(char **)&local_78);
}

Assistant:

bool FileExists(const std::string &filename) {
    std::ifstream ifs(filename);
    return (bool)ifs;
}